

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

bool __thiscall
glslang::TSymbolValidater::qualifierCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined3 in_register_00000081;
  bool bVar4;
  string errorStr;
  long lVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*type1->_vptr_TType[0xb])(type1);
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*type2->_vptr_TType[0xb])(type2);
  lVar3 = CONCAT44(extraout_var_00,iVar1);
  if (CONCAT31(in_register_00000081,isBlock) == 0) {
    iVar1 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_01,iVar1) + 8) & 0x7f) != 5) goto LAB_00377b1e;
    iVar1 = (*type2->_vptr_TType[0xb])(type2);
    if ((*(uint *)(CONCAT44(extraout_var_02,iVar1) + 8) & 0x7f) != 5) goto LAB_00377b1e;
LAB_00377b4f:
    bVar4 = ((*(uint *)(lVar3 + 8) ^ *(uint *)(lVar2 + 8)) & 0xe000000) != 0;
    if (bVar4) {
      std::operator+(&errorStr,name,": have precision conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
    if (((*(char *)(lVar2 + 0x2c) != '\0') && (*(char *)(lVar3 + 0x2c) != '\0')) &&
       (*(char *)(lVar2 + 0x2c) != *(char *)(lVar3 + 0x2c))) {
      std::operator+(&errorStr,name,": have layout format conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      bVar4 = true;
    }
  }
  else {
LAB_00377b1e:
    iVar1 = (*type1->_vptr_TType[0xb])(type1);
    if ((*(uint *)(CONCAT44(extraout_var_03,iVar1) + 8) & 0x7f) == 1) {
      iVar1 = (*type2->_vptr_TType[0xb])(type2);
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar1) + 8) & 0x7f) == 1) goto LAB_00377b4f;
    }
    bVar4 = false;
  }
  if (isBlock) {
    if (((*(byte *)(lVar3 + 0x10) ^ *(byte *)(lVar2 + 0x10)) & 0xf) != 0) {
      std::operator+(&errorStr,name,": have layoutPacking conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      bVar4 = true;
    }
    if ((*(ulong *)(lVar3 + 8) ^ *(ulong *)(lVar2 + 8)) >> 0x3d != 0) {
      std::operator+(&errorStr,name,": have layoutMatrix conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      bVar4 = true;
    }
    if (*(int *)(lVar2 + 0x14) != *(int *)(lVar3 + 0x14)) {
      std::operator+(&errorStr,name,": have layoutOffset conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      bVar4 = true;
    }
    if (*(int *)(lVar2 + 0x18) != *(int *)(lVar3 + 0x18)) {
      std::operator+(&errorStr,name,": have layoutAlign conflict cross stage.");
      TInfoSinkBase::message(&this->infoSink->info,EPrefixError,errorStr._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool qualifierCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        const TQualifier& qualifier1 = type1->getQualifier();
        const TQualifier& qualifier2 = type2->getQualifier();

        if (((isBlock == false) &&
            (type1->getQualifier().storage == EvqUniform && type2->getQualifier().storage == EvqUniform)) ||
            (type1->getQualifier().storage == EvqGlobal && type2->getQualifier().storage == EvqGlobal)) {
            if (qualifier1.precision != qualifier2.precision) {
                hasError = true;
                std::string errorStr = name + ": have precision conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.hasFormat() && qualifier2.hasFormat()) {
                if (qualifier1.layoutFormat != qualifier2.layoutFormat) {
                    hasError = true;
                    std::string errorStr = name + ": have layout format conflict cross stage.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                }

            }
        }

        if (isBlock == true) {
            if (qualifier1.layoutPacking != qualifier2.layoutPacking) {
                hasError = true;
                std::string errorStr = name + ": have layoutPacking conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutMatrix != qualifier2.layoutMatrix) {
                hasError = true;
                std::string errorStr = name + ": have layoutMatrix conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutOffset != qualifier2.layoutOffset) {
                hasError = true;
                std::string errorStr = name + ": have layoutOffset conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutAlign != qualifier2.layoutAlign) {
                hasError = true;
                std::string errorStr = name + ": have layoutAlign conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
        }

        return hasError;
    }